

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bof.hpp
# Opt level: O2

void __thiscall Excel::BOF::parse(BOF *this,Record *record)

{
  BiffVersion BVar1;
  SubstreamType SVar2;
  BiffVersion BVar3;
  int16_t type;
  int16_t version;
  
  version = 0;
  type = 0;
  Stream::read<short>(&(record->m_stream).super_Stream,&version,2);
  Stream::read<short>(&(record->m_stream).super_Stream,&type,2);
  BVar3 = BIFF7;
  if (version != 0x500) {
    BVar3 = UnknownVersion;
  }
  BVar1 = BIFF8;
  if (version != 0x600) {
    BVar1 = BVar3;
  }
  this->m_version = BVar1;
  SVar2 = (SubstreamType)(ushort)type;
  if (type != 5) {
    if (type == 0x100) {
      SVar2 = WorkSpace;
    }
    else if (type == 0x10) {
      SVar2 = WorkSheet;
    }
    else if (type == 0x20) {
      SVar2 = Chart;
    }
    else if (type == 0x40) {
      SVar2 = MacroSheet;
    }
    else if (type == 6) {
      SVar2 = VisualBasicModule;
    }
    else {
      SVar2 = UnknownType;
    }
  }
  this->m_type = SVar2;
  return;
}

Assistant:

inline void
BOF::parse( Record & record )
{
	int16_t version = 0;
	int16_t type = 0;

	record.dataStream().read( version, 2 );
	record.dataStream().read( type, 2 );

	switch( version )
	{
		case BIFF8 :
			m_version = BIFF8;
			break;

		case BIFF7 :
			m_version = BIFF7;
			break;

		default :
			m_version = UnknownVersion;
			break;
	}

	switch( type )
	{
		case WorkBookGlobals :
			m_type = WorkBookGlobals;
			break;

		case VisualBasicModule :
			m_type = VisualBasicModule;
			break;

		case WorkSheet :
			m_type = WorkSheet;
			break;

		case Chart :
			m_type = Chart;
			break;

		case MacroSheet :
			m_type = MacroSheet;
			break;

		case WorkSpace :
			m_type = WorkSpace;
			break;

		default :
			m_type = UnknownType;
			break;
	}
}